

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Span<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node>::freeData
          (Span<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node> *this)

{
  byte bVar1;
  QList<QString> *pQVar2;
  Node *pNVar3;
  Node *in_RDI;
  uchar o;
  uchar *__end4;
  uchar *__begin4;
  uchar (*__range4) [128];
  Node *local_18;
  
  if (in_RDI[1].value.t != (QList<QString> *)0x0) {
    pNVar3 = in_RDI + 1;
    for (local_18 = in_RDI; local_18 != (Node *)&pNVar3->value;
        local_18 = (Node *)((long)&(local_18->super_Chain).prev + 1)) {
      bVar1 = *(byte *)&(local_18->super_Chain).prev;
      if (bVar1 != 0xff) {
        Entry::node((Entry *)(in_RDI[1].value.t + (ulong)bVar1 * 3));
        QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node::~Node(in_RDI);
      }
    }
    pQVar2 = in_RDI[1].value.t;
    if (pQVar2 != (QList<QString> *)0x0) {
      operator_delete__(pQVar2);
    }
    in_RDI[1].value.t = (QList<QString> *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }